

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_is_transient
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  CVmObjTable *in_RDX;
  undefined4 in_stack_ffffffffffffffa8;
  vm_obj_id_t in_stack_ffffffffffffffac;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if ((getp_is_transient(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_is_transient(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_is_transient::desc,0);
    __cxa_guard_release(&getp_is_transient(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                              (CVmNativeCodeDesc *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (iVar1 == 0) {
    iVar1 = CVmObjTable::is_obj_transient(in_RDX,in_stack_ffffffffffffffac);
    vm_val_t::set_logical((vm_val_t *)in_RDX,iVar1);
  }
  return 1;
}

Assistant:

int CVmObject::getp_is_transient(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc,
                                 vm_prop_id_t, vm_obj_id_t *)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* indicate whether or not we're transient */
    retval->set_logical(G_obj_table->is_obj_transient(self));

    /* handled */
    return TRUE;
}